

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::tableOther(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *this_01;
  RefAST RVar1;
  bool bVar2;
  int iVar3;
  NoViableAltException *pNVar4;
  RefAST *this_02;
  RefAST tmp61_AST;
  RefAST tmp63_AST;
  RefAST tmp62_AST;
  RefCount<AST> local_a0;
  RefCount<Token> local_98;
  ASTFactory local_90;
  RefCount<Token> local_80;
  RefCount<Token> local_78;
  RefAST tmp60_AST;
  ASTPair currentAST;
  RefAST local_58;
  RefToken local_50;
  RefToken local_48;
  RefAST local_40;
  RefAST local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_a0.ref = nullAST.ref;
  currentAST.root.ref = (Ref *)0x0;
  currentAST.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 2;
  }
  tmp60_AST.ref = local_a0.ref;
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
  this_01 = &(this->super_LLkParser).super_Parser.astFactory;
  ASTFactory::create((ASTFactory *)&tmp61_AST,(RefToken *)this_01);
  RefCount<AST>::operator=(&tmp60_AST,&tmp61_AST);
  RefCount<AST>::~RefCount(&tmp61_AST);
  RefCount<Token>::~RefCount(&local_78);
  Parser::match((Parser *)this,6);
  tmp61_AST = nullAST;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
  ASTFactory::create((ASTFactory *)&tmp62_AST,(RefToken *)this_01);
  RefCount<AST>::operator=(&tmp61_AST,&tmp62_AST);
  RefCount<AST>::~RefCount(&tmp62_AST);
  RefCount<Token>::~RefCount(&local_80);
  if (tmp61_AST.ref != (Ref *)0x0) {
    (tmp61_AST.ref)->count = (tmp61_AST.ref)->count + 1;
  }
  local_38.ref = tmp61_AST.ref;
  ASTFactory::addASTChild(this_01,&currentAST,&local_38);
  RefCount<AST>::~RefCount(&local_38);
  Parser::match((Parser *)this,0xd);
  tmp62_AST = nullAST;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_90.nodeFactory,this,1);
  ASTFactory::create((ASTFactory *)&tmp63_AST,(RefToken *)this_01);
  RefCount<AST>::operator=(&tmp62_AST,&tmp63_AST);
  RefCount<AST>::~RefCount(&tmp63_AST);
  RefCount<Token>::~RefCount((RefCount<Token> *)&local_90.nodeFactory);
  Parser::match((Parser *)this,7);
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 == 0xb) {
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    if (iVar3 != 0xc) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      if (iVar3 != 0xd) goto LAB_00167d7a;
    }
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
    if (3 < iVar3) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
      if (iVar3 < 0x72) {
        directives(this);
        local_40.ref = this_00->ref;
        if (local_40.ref != (Ref *)0x0) {
          (local_40.ref)->count = (local_40.ref)->count + 1;
        }
        ASTFactory::addASTChild(this_01,&currentAST,&local_40);
        RefCount<AST>::~RefCount(&local_40);
        goto LAB_00167de8;
      }
    }
  }
LAB_00167d7a:
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (3 < iVar3) {
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar3 < 0x72) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      bVar2 = BitSet::member(&_tokenSet_4,iVar3);
      if (bVar2) {
        iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
        bVar2 = BitSet::member(&_tokenSet_4,iVar3);
        if (bVar2) {
LAB_00167de8:
          iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
          if (iVar3 == 8) {
            iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
            if (3 < iVar3) {
              iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
              if (iVar3 < 0x72) {
                iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
                bVar2 = BitSet::member(&_tokenSet_4,iVar3);
                RVar1 = nullAST;
                if (bVar2) {
                  if (nullAST.ref != (Ref *)0x0) {
                    (nullAST.ref)->count = (nullAST.ref)->count + 1;
                  }
                  tmp63_AST = RVar1;
                  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_98,this,1);
                  ASTFactory::create(&local_90,(RefToken *)this_01);
                  RefCount<AST>::operator=(&tmp63_AST,(RefCount<AST> *)&local_90);
                  RefCount<AST>::~RefCount((RefCount<AST> *)&local_90);
                  RefCount<Token>::~RefCount(&local_98);
                  Parser::match((Parser *)this,8);
                  this_02 = &tmp63_AST;
                  while( true ) {
                    RefCount<AST>::~RefCount(this_02);
LAB_001680c9:
                    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
                    bVar2 = BitSet::member(&_tokenSet_13,iVar3);
                    if (!bVar2) break;
                    otherEntry(this);
                    local_58.ref = this_00->ref;
                    if (local_58.ref != (Ref *)0x0) {
                      (local_58.ref)->count = (local_58.ref)->count + 1;
                    }
                    ASTFactory::addASTChild(this_01,&currentAST,&local_58);
                    this_02 = &local_58;
                  }
                  RefCount<AST>::operator=(&local_a0,&currentAST.root);
                  RefCount<AST>::~RefCount(&tmp62_AST);
                  RefCount<AST>::~RefCount(&tmp61_AST);
                  RefCount<AST>::~RefCount(&tmp60_AST);
                  RefCount<AST>::operator=(this_00,&local_a0);
                  RefCount<AST>::~RefCount(&local_a0);
                  ASTPair::~ASTPair(&currentAST);
                  return;
                }
              }
            }
          }
          iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
          if (3 < iVar3) {
            iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
            if (iVar3 < 0x72) {
              iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
              bVar2 = BitSet::member(&_tokenSet_4,iVar3);
              if (bVar2) {
                iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
                bVar2 = BitSet::member(&_tokenSet_4,iVar3);
                if (bVar2) goto LAB_001680c9;
              }
            }
          }
          pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
          (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_50,this,1);
          NoViableAltException::NoViableAltException(pNVar4,&local_50);
          __cxa_throw(pNVar4,&NoViableAltException::typeinfo,
                      NoViableAltException::~NoViableAltException);
        }
      }
    }
  }
  pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_48,this,1);
  NoViableAltException::NoViableAltException(pNVar4,&local_48);
  __cxa_throw(pNVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
}

Assistant:

void GrpParser::tableOther() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST tableOther_AST = nullAST;
	
	try {      // for error handling
		RefAST tmp60_AST = nullAST;
		tmp60_AST = astFactory.create(LT(1));
		match(OP_LPAREN);
		RefAST tmp61_AST = nullAST;
		tmp61_AST = astFactory.create(LT(1));
		astFactory.addASTChild(currentAST, tmp61_AST);
		match(IDENT);
		RefAST tmp62_AST = nullAST;
		tmp62_AST = astFactory.create(LT(1));
		match(OP_RPAREN);
		{
		if ((LA(1)==OP_LBRACE) && (LA(2)==OP_RBRACE||LA(2)==IDENT) && ((LA(3) >= OP_EQ && LA(3) <= AT_IDENT))) {
			directives();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if (((LA(1) >= OP_EQ && LA(1) <= AT_IDENT)) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		{
		if ((LA(1)==OP_SEMI) && ((LA(2) >= OP_EQ && LA(2) <= AT_IDENT)) && (_tokenSet_4.member(LA(3)))) {
			RefAST tmp63_AST = nullAST;
			tmp63_AST = astFactory.create(LT(1));
			match(OP_SEMI);
		}
		else if (((LA(1) >= OP_EQ && LA(1) <= AT_IDENT)) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		{
		do {
			if ((_tokenSet_13.member(LA(1)))) {
				otherEntry();
				astFactory.addASTChild(currentAST, returnAST);
			}
			else {
				goto _loop341;
			}
			
		} while (true);
		_loop341:;
		}
		tableOther_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_11);
	}
	returnAST = tableOther_AST;
}